

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TPublicType::initQualifiers(TPublicType *this,bool global)

{
  undefined3 in_register_00000031;
  
  TQualifier::clear(&this->qualifier);
  if (CONCAT31(in_register_00000031,global) != 0) {
    *(ulong *)&(this->qualifier).field_0x8 =
         (*(ulong *)&(this->qualifier).field_0x8 & 0xffffffffffffff80) + 1;
  }
  return;
}

Assistant:

void initQualifiers(bool global = false)
    {
        qualifier.clear();
        if (global)
            qualifier.storage = EvqGlobal;
    }